

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::OutputWheatsheafAndWheatsheafMean
          (aggreports *this,vector<int,_std::allocator<int>_> *handles,int eptype,int eptype_tvar,
          offset_in_OutLosses_to_subr GetOutLoss)

{
  bool bVar1;
  int *piVar2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  _Vector_base<int,_std::allocator<int>_> *p_Var5;
  int in_R9D;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> ensemble;
  _Vector_base<int,_std::allocator<int>_> local_90;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  iVar4 = 0;
  for (piVar2 = (handles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      piVar2 != (handles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    iVar4 = iVar4 + (this->outputFlags_[*piVar2] ^ 1);
  }
  if (iVar4 != 2) {
    bVar1 = this->ordFlag_;
    iVar4 = ((uint)bVar1 + (uint)bVar1 ^ 2) + (uint)bVar1 + (uint)bVar1 * 2;
    if ((this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      p_Var5 = &local_48;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)p_Var5,handles);
      WheatsheafAndWheatsheafMean
                (this,(vector<int,_std::allocator<int>_> *)p_Var5,GetOutLoss,in_R9D,iVar4,
                 eptype * (uint)bVar1,eptype_tvar);
    }
    else {
      p_Var5 = &local_60;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)p_Var5,handles);
      WheatsheafAndWheatsheafMeanWithWeighting
                (this,(vector<int,_std::allocator<int>_> *)p_Var5,GetOutLoss,in_R9D,iVar4,
                 eptype * (uint)bVar1,eptype_tvar);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(p_Var5);
    if ((this->ordFlag_ == false) &&
       ((this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      for (p_Var3 = (this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(this->ensembletosidx_)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                  (&ensemble,
                   (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)(p_Var3 + 1));
        if ((this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_90,handles);
          p_Var5 = &local_90;
          WheatsheafAndWheatsheafMean
                    (this,(vector<int,_std::allocator<int>_> *)p_Var5,GetOutLoss,in_R9D,iVar4,
                     ensemble.first,eptype_tvar);
        }
        else {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_78,handles);
          WheatsheafAndWheatsheafMeanWithWeighting
                    (this,(vector<int,_std::allocator<int>_> *)&local_78,GetOutLoss,in_R9D,iVar4,
                     ensemble.first,eptype_tvar);
          p_Var5 = &local_78;
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(p_Var5);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&ensemble.second.super__Vector_base<int,_std::allocator<int>_>);
      }
    }
  }
  return;
}

Assistant:

void aggreports::OutputWheatsheafAndWheatsheafMean(const std::vector<int> &handles,
	int eptype, const int eptype_tvar,
	OASIS_FLOAT (OutLosses::*GetOutLoss)()) {

  int falseCount = 0;
  for (auto it = handles.begin(); it != handles.end(); ++it) {
    if (outputFlags_[*it] == false) falseCount++;
  }
  if (falseCount == 2) return;

  // EPCalc = PERSAMPLEMEAN for ORD output
  // EPCalc = 2 for legacy output
  int epcalc = ordFlag_ * PERSAMPLEMEAN + !ordFlag_ * 2;
  // EPType doubles as ensemble ID for legacy output
  eptype *= ordFlag_;   // Set to default value 0 in legacy output

  if (periodstoweighting_.size() == 0) {
    WheatsheafAndWheatsheafMean(handles, GetOutLoss, epcalc, eptype,
				eptype_tvar);
  } else {
    WheatsheafAndWheatsheafMeanWithWeighting(handles, GetOutLoss, epcalc,
					     eptype, eptype_tvar);
  }

  // By ensemble ID
  if (ordFlag_) return;   // Ensemble IDs not supported for ORD output
  if (ensembletosidx_.size() > 0) {
    for (auto ensemble : ensembletosidx_) {
      if (periodstoweighting_.size() == 0) {
	WheatsheafAndWheatsheafMean(handles, GetOutLoss, epcalc, ensemble.first,
				    eptype_tvar, ensemble.first);
      } else {
	WheatsheafAndWheatsheafMeanWithWeighting(handles, GetOutLoss, epcalc,
						 ensemble.first, eptype_tvar,
						 ensemble.first);
      }
    }
  }

}